

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

void vkt::pipeline::anon_unknown_0::initMultisamplePrograms
               (SourceCollections *sources,GeometryType geometryType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ProgramSources *pPVar3;
  long lVar4;
  char *pcVar5;
  ostringstream vertexSource;
  long *local_210;
  long local_208;
  long local_200 [2];
  string local_1f0;
  uint local_1d0;
  value_type local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "#version 310 es\nlayout(location = 0) in vec4 position;\nlayout(location = 1) in vec4 color;\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n\tgl_Position = position;\n\tvtxColor = color;\n"
             ,200);
  pcVar5 = "";
  if (geometryType == GEOMETRY_TYPE_OPAQUE_POINT) {
    pcVar5 = "\tgl_PointSize = 3.0f;\n";
  }
  lVar4 = 0x16;
  if (geometryType != GEOMETRY_TYPE_OPAQUE_POINT) {
    lVar4 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  paVar1 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"color_vert","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add(&sources->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 0;
  paVar2 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"color_frag","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add(&sources->glslSources,&local_1f0);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "#version 310 es\nlayout(location = 0) in highp vec4 vtxColor;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vtxColor;\n}\n"
             ,"");
  local_1d0 = 1;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void initMultisamplePrograms (SourceCollections& sources, GeometryType geometryType)
{
	std::ostringstream vertexSource;

	vertexSource <<
		"#version 310 es\n"
		"layout(location = 0) in vec4 position;\n"
		"layout(location = 1) in vec4 color;\n"
		"layout(location = 0) out highp vec4 vtxColor;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = position;\n"
		"	vtxColor = color;\n"
		<< (geometryType == GEOMETRY_TYPE_OPAQUE_POINT ? "	gl_PointSize = 3.0f;\n"
														 : "" )
		<< "}\n";

	static const char* fragmentSource =
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 vtxColor;\n"
		"layout(location = 0) out highp vec4 fragColor;\n"
		"void main (void)\n"
		"{\n"
		"	fragColor = vtxColor;\n"
		"}\n";

	sources.glslSources.add("color_vert") << glu::VertexSource(vertexSource.str());
	sources.glslSources.add("color_frag") << glu::FragmentSource(fragmentSource);
}